

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_cmov(secp256k1_gej *r,secp256k1_gej *a,int flag)

{
  secp256k1_fe_impl_cmov(&r->x,&a->x,flag);
  secp256k1_fe_impl_cmov(&r->y,&a->y,flag);
  secp256k1_fe_impl_cmov(&r->z,&a->z,flag);
  r->infinity = (a->infinity ^ r->infinity) & flag ^ r->infinity;
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_cmov(secp256k1_gej *r, const secp256k1_gej *a, int flag) {
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_GEJ_VERIFY(a);

    secp256k1_fe_cmov(&r->x, &a->x, flag);
    secp256k1_fe_cmov(&r->y, &a->y, flag);
    secp256k1_fe_cmov(&r->z, &a->z, flag);
    r->infinity ^= (r->infinity ^ a->infinity) & flag;

    SECP256K1_GEJ_VERIFY(r);
}